

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int event_callback_cancel(uint id)

{
  int pi;
  evtCallback_t *__ptr;
  evtCallback_t *peVar1;
  evtCallback_t *peVar2;
  evtCallback_t **ppeVar3;
  
  ppeVar3 = &geCallBackFirst;
  while( true ) {
    __ptr = *ppeVar3;
    if (__ptr == (evtCallback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == id) break;
    ppeVar3 = &__ptr->next;
  }
  pi = __ptr->pi;
  peVar1 = __ptr->prev;
  ppeVar3 = &geCallBackFirst;
  if (peVar1 != (evtCallback_t *)0x0) {
    ppeVar3 = &peVar1->next;
  }
  peVar2 = __ptr->next;
  *ppeVar3 = peVar2;
  ppeVar3 = &geCallBackLast;
  if (peVar2 != (evtCallback_t *)0x0) {
    ppeVar3 = &peVar2->prev;
  }
  *ppeVar3 = peVar1;
  free(__ptr);
  findEventBits(pi);
  return 0;
}

Assistant:

int event_callback_cancel(unsigned id)
{
   evtCallback_t *ep;
   int pi;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->id == id)
      {
         pi = ep->pi;

         if (ep->prev) {ep->prev->next = ep->next;}
         else          {geCallBackFirst = ep->next;}

         if (ep->next) {ep->next->prev = ep->prev;}
         else          {geCallBackLast = ep->prev;}

         free(ep);

         findEventBits(pi);

         return 0;
      }
      ep = ep->next;
   }
   return pigif_callback_not_found;
}